

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffasfm(char *tform,int *dtcode,long *twidth,int *decimals,int *status)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long width;
  float fwidth;
  char *local_e8;
  long longval;
  char temp [71];
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  if (dtcode != (int *)0x0) {
    *dtcode = 0;
  }
  if (twidth != (long *)0x0) {
    *twidth = 0;
  }
  if (decimals != (int *)0x0) {
    *decimals = 0;
  }
  pcVar6 = tform + -1;
  do {
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar1 == ' ');
  sVar4 = strlen(pcVar6);
  if (0x46 < sVar4) {
    pcVar6 = "Error: ASCII table TFORM code is too long (ffasfm)";
LAB_00176f3e:
    ffpmsg(pcVar6);
    *status = 0x105;
    return 0x105;
  }
  local_e8 = tform;
  strcpy(temp,pcVar6);
  ffupch(temp);
  if (temp[0] == '\0') {
    pcVar6 = "Error: ASCII table TFORM code is blank";
    goto LAB_00176f3e;
  }
  if (temp[0] == 'A') {
    iVar5 = 0x10;
    goto LAB_00176f75;
  }
  switch(temp[0]) {
  case 'D':
    iVar5 = 0x52;
    break;
  case 'E':
  case 'F':
    iVar5 = 0x2a;
    break;
  default:
    snprintf(message,0x51,"Illegal ASCII table TFORMn datatype: \'%s\'",local_e8);
    ffpmsg(message);
    *status = 0x106;
    return 0x106;
  case 'I':
    iVar5 = 0x29;
    bVar2 = true;
    goto LAB_00176f79;
  }
LAB_00176f75:
  bVar2 = false;
LAB_00176f79:
  if (dtcode != (int *)0x0) {
    *dtcode = iVar5;
  }
  if ((bool)(temp[0] != 'A' & (bVar2 ^ 1U))) {
    iVar3 = ffc2rr(temp + 1,&fwidth,status);
    if (iVar3 < 1) {
      if (fwidth <= 0.0) goto LAB_00176fda;
      lVar7 = (long)fwidth;
      iVar3 = iVar5;
      if (temp[0] == 'F') {
        iVar3 = 0x52;
      }
      if (7 < lVar7) {
        iVar5 = iVar3;
      }
      pcVar6 = temp + 2;
      if (9 < lVar7) {
        pcVar6 = temp + 3;
      }
      width = lVar7;
      if (*pcVar6 == '.') {
        pcVar6 = temp + 4;
        if (lVar7 < 10) {
          pcVar6 = temp + 3;
        }
        iVar3 = ffc2ii(pcVar6,&longval,status);
        if (iVar3 < 1) {
          if (decimals != (int *)0x0) {
            *decimals = (int)longval;
          }
          if (lVar7 <= longval) {
            *status = 0x105;
          }
          iVar3 = 0x52;
          if (temp[0] != 'E') {
            iVar3 = iVar5;
          }
          if (6 < longval) {
            iVar5 = iVar3;
          }
        }
      }
    }
LAB_00176fd5:
    if (*status < 1) goto LAB_00177006;
  }
  else {
    iVar3 = ffc2ii(temp + 1,&width,status);
    if (0 < iVar3) goto LAB_00176fd5;
    if (0 < width) {
      iVar3 = 0x15;
      if (4 < (ulong)width) {
        iVar3 = iVar5;
      }
      if (bVar2) {
        iVar5 = iVar3;
      }
      goto LAB_00176fd5;
    }
    width = 0;
  }
LAB_00176fda:
  *status = 0x105;
  snprintf(message,0x51,"Illegal ASCII table TFORMn code: \'%s\'",local_e8);
  ffpmsg(message);
LAB_00177006:
  if (dtcode != (int *)0x0) {
    *dtcode = iVar5;
  }
  if (twidth != (long *)0x0) {
    *twidth = width;
  }
  return *status;
}

Assistant:

int ffasfm(char *tform,    /* I - format code from the TFORMn keyword */
           int *dtcode,    /* O - numerical datatype code */
           long *twidth,   /* O - width of the field, in chars */
           int *decimals,  /* O - number of decimal places (F, E, D format) */
           int *status)    /* IO - error status      */
{
/*
  parse the ASCII table TFORM column format to determine the data
  type, the field width, and number of decimal places (if relevant)
*/
    int ii, datacode;
    long longval, width;
    float fwidth;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (twidth)
        *twidth = 0;

    if (decimals)
        *decimals = 0;

    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: ASCII table TFORM code is too long (ffasfm)");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */


    if (form[0] == 0)
    {
        ffpmsg("Error: ASCII table TFORM code is blank");
        return(*status = BAD_TFORM);
    }

    /*-----------------------------------------------*/
    /*       determine default datatype code         */
    /*-----------------------------------------------*/
    if (form[0] == 'A')
        datacode = TSTRING;
    else if (form[0] == 'I')
        datacode = TLONG;
    else if (form[0] == 'F')
        datacode = TFLOAT;
    else if (form[0] == 'E')
        datacode = TFLOAT;
    else if (form[0] == 'D')
        datacode = TDOUBLE;
    else
    {
        snprintf(message, FLEN_ERRMSG,
                "Illegal ASCII table TFORMn datatype: \'%s\'", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (dtcode)
       *dtcode = datacode;

    form++;  /* point to the start of field width */

    if (datacode == TSTRING || datacode == TLONG)
    { 
        /*-----------------------------------------------*/
        /*              A or I data formats:             */
        /*-----------------------------------------------*/

        if (ffc2ii(form, &width, status) <= 0)  /* read the width field */
        {
            if (width <= 0)
            {
                width = 0;
                *status = BAD_TFORM;
            }
            else
            {                
                /* set to shorter precision if I4 or less */
                if (width <= 4 && datacode == TLONG)
                    datacode = TSHORT;
            }
        }
    }
    else
    {  
        /*-----------------------------------------------*/
        /*              F, E or D data formats:          */
        /*-----------------------------------------------*/

        if (ffc2rr(form, &fwidth, status) <= 0) /* read ww.dd width field */
        {
           if (fwidth <= 0.)
            *status = BAD_TFORM;
          else
          {
            width = (long) fwidth;  /* convert from float to long */

            if (width > 7 && *temp == 'F')
                datacode = TDOUBLE;  /* type double if >7 digits */

            if (width < 10)
                form = form + 1; /* skip 1 digit  */
            else
                form = form + 2; /* skip 2 digits */

            if (form[0] == '.') /* should be a decimal point here */
            {
                form++;  /*  point to start of decimals field */

                if (ffc2ii(form, &longval, status) <= 0) /* read decimals */
                {
                    if (decimals)
                        *decimals = longval;  /* long to short convertion */

                    if (longval >= width)  /* width < no. of decimals */
                        *status = BAD_TFORM; 

                    if (longval > 6 && *temp == 'E')
                        datacode = TDOUBLE;  /* type double if >6 digits */
                }
            }

          }
        }
    }
    if (*status > 0)
    {
        *status = BAD_TFORM;
        snprintf(message,FLEN_ERRMSG,"Illegal ASCII table TFORMn code: \'%s\'", tform);
        ffpmsg(message);
    }

    if (dtcode)
       *dtcode = datacode;

    if (twidth)
       *twidth = width;

    return(*status);
}